

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
addAll<capnp::schema::Node::SourceInfo::Reader*>
          (Vector<capnp::schema::Node::SourceInfo::Reader> *this,Reader *begin,Reader *end)

{
  Reader *pRVar1;
  size_t minCapacity;
  size_t __n;
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *__dest;
  
  pRVar1 = (this->builder).ptr;
  __dest = (this->builder).pos;
  __n = (long)end - (long)begin;
  minCapacity = (long)__n / 0x30 + ((long)__dest - (long)pRVar1) / 0x30;
  if ((ulong)(((long)(this->builder).endPtr - (long)pRVar1) / 0x30) < minCapacity) {
    grow(this,minCapacity);
    __dest = (this->builder).pos;
  }
  if (end != begin) {
    memcpy(__dest,begin,__n);
  }
  (this->builder).pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)((long)__dest + __n)
  ;
  return;
}

Assistant:

inline void addAll(Iterator begin, Iterator end) {
    size_t needed = builder.size() + (end - begin);
    if (needed > builder.capacity()) grow(needed);
    builder.addAll(begin, end);
  }